

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::BuiltInAssignmentTest::prepareNextTestCase
          (BuiltInAssignmentTest *this,GLuint test_case_index)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_1a8;
  char *local_28;
  GLchar *description;
  BuiltInAssignmentTest *pBStack_18;
  GLuint test_case_index_local;
  BuiltInAssignmentTest *this_local;
  
  if (test_case_index + 1 < 2) {
    local_28 = "Testing gl_MinProgramTexelOffset";
  }
  else {
    if (test_case_index != 1) {
      return false;
    }
    local_28 = "Testing gl_MaxProgramTexelOffset";
  }
  this->m_case = test_case_index;
  description._4_4_ = test_case_index;
  pBStack_18 = this;
  this_00 = deqp::Context::getTestContext(*(Context **)&this->field_0x70);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<(&local_1a8,&local_28);
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  return true;
}

Assistant:

bool BuiltInAssignmentTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	const GLchar* description = 0;

	switch (test_case_index)
	{
	case (glw::GLuint)-1:
	case 0:
		description = "Testing gl_MinProgramTexelOffset";
		break;
	case 1:
		description = "Testing gl_MaxProgramTexelOffset";
		break;
	default:
		return false;
	}

	m_case = test_case_index;

	m_context.getTestContext().getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

	return true;
}